

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O3

int google::protobuf::Base64UnescapeInternal
              (char *src_param,int szsrc,char *dest,int szdest,char *unbase64)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  byte *pbVar11;
  byte *pbVar12;
  ulong uVar13;
  byte *pbVar14;
  byte *pbVar15;
  byte *pbVar16;
  uint uVar17;
  bool bVar18;
  ulong uVar7;
  
  pbVar11 = (byte *)src_param;
  if (dest == (char *)0x0) {
    if (3 < szsrc) {
      uVar8 = 0;
      uVar9 = 0;
LAB_002c53f8:
      if (((((ulong)*pbVar11 == 0) || ((ulong)pbVar11[1] == 0)) ||
          (pbVar16 = (byte *)(ulong)pbVar11[2], pbVar16 == (byte *)0x0)) ||
         (uVar5 = (int)unbase64[pbVar11[3]] |
                  (int)unbase64[(long)pbVar16] << 6 |
                  (int)unbase64[pbVar11[1]] << 0xc | (int)unbase64[*pbVar11] << 0x12,
         uVar8 = (ulong)uVar5, (int)uVar5 < 0)) {
        uVar5 = szsrc + 1;
        pbVar15 = pbVar11 + 2;
        pbVar12 = pbVar11 + 3;
        iVar4 = szsrc - 2;
        pbVar14 = pbVar11 + 4;
        src_param = (char *)(pbVar11 + 1);
        uVar3 = szsrc;
LAB_002c5471:
        pbVar16 = (byte *)src_param;
        uVar3 = uVar3 - 1;
        bVar1 = pbVar16[-1];
        uVar10 = (uint)bVar1;
        uVar6 = (uint)unbase64[bVar1];
        if (unbase64[bVar1] < '\0') {
          src_param = (char *)(ulong)(bVar1 - 9);
          if ((bVar1 - 9 < 5) || (bVar1 == 0x20)) goto LAB_002c548b;
          szsrc = uVar5 - 2;
          goto LAB_002c5683;
        }
        goto LAB_002c54ef;
      }
      szsrc = szsrc - 4;
      pbVar11 = pbVar11 + 4;
      uVar6 = 0xffffffff;
      uVar10 = 0;
      goto LAB_002c5583;
    }
  }
  else if (3 < szsrc) {
    uVar7 = 0;
    uVar13 = 0;
LAB_002c5215:
    if (((((ulong)*pbVar11 == 0) || ((ulong)pbVar11[1] == 0)) ||
        (src_param = (char *)(ulong)pbVar11[2], (byte *)src_param == (byte *)0x0)) ||
       (uVar5 = (int)unbase64[pbVar11[3]] |
                (int)unbase64[(long)src_param] << 6 |
                (int)unbase64[pbVar11[1]] << 0xc | (int)unbase64[*pbVar11] << 0x12,
       uVar7 = (ulong)uVar5, (int)uVar5 < 0)) {
      uVar5 = szsrc + 1;
      pbVar16 = pbVar11 + 2;
      pbVar15 = pbVar11 + 3;
      iVar4 = szsrc - 2;
      pbVar12 = pbVar11 + 4;
      src_param = (char *)(pbVar11 + 1);
      uVar3 = szsrc;
LAB_002c528d:
      pbVar14 = (byte *)src_param;
      uVar3 = uVar3 - 1;
      bVar1 = pbVar14[-1];
      uVar10 = (uint)bVar1;
      uVar17 = (uint)unbase64[bVar1];
      if (unbase64[bVar1] < '\0') {
        src_param = (char *)(ulong)(bVar1 - 9);
        if ((bVar1 - 9 < 5) || (bVar1 == 0x20)) goto LAB_002c52a8;
        szsrc = uVar5 - 2;
        goto LAB_002c5662;
      }
      goto LAB_002c5308;
    }
    szsrc = szsrc - 4;
    pbVar11 = pbVar11 + 4;
    uVar10 = 0;
    uVar6 = 0xffffffff;
    goto LAB_002c53af;
  }
  uVar8 = 0;
  uVar5 = 0;
  uVar9 = 0;
LAB_002c559c:
  if (0 < szsrc) {
    do {
      while( true ) {
        bVar1 = *pbVar11;
        if (-1 < unbase64[bVar1]) break;
        if (4 < bVar1 - 9) {
          if (0x2d < bVar1) {
            if ((bVar1 != 0x2e) && (bVar1 != 0x3d)) {
              return -1;
            }
            goto LAB_002c563e;
          }
          if (bVar1 != 0x20) {
            if (bVar1 != 0) {
              return -1;
            }
            iVar4 = (*(code *)((long)&DAT_003a3ec0 + (long)(int)(&DAT_003a3ec0)[uVar5]))
                              (src_param,
                               (code *)((long)&DAT_003a3ec0 + (long)(int)(&DAT_003a3ec0)[uVar5]),
                               uVar8,uVar9 & 0xffffffff,0xffffffff);
            return iVar4;
          }
        }
        bVar18 = (uint)szsrc < 2;
        pbVar11 = pbVar11 + 1;
        szsrc = szsrc - 1;
        if (bVar18) goto LAB_002c563e;
      }
      uVar6 = (int)uVar8 << 6;
      uVar3 = (int)unbase64[bVar1] | uVar6;
      uVar5 = uVar5 + 1;
      if (uVar5 == 4) {
        uVar10 = (int)uVar9 + 3;
        uVar5 = 0;
        if (dest != (char *)0x0) {
          if (szdest < (int)uVar10) {
            return -1;
          }
          src_param = (char *)(long)(int)uVar9;
          (dest + 2)[(long)src_param] = (char)uVar3;
          (dest + 1)[(long)src_param] = (char)(uVar6 >> 8);
          dest[(long)src_param] = (char)(uVar6 >> 0x10);
        }
        uVar9 = (ulong)uVar10;
        uVar8 = 0;
      }
      else {
        uVar8 = (ulong)uVar3;
      }
      bVar18 = 1 < (uint)szsrc;
      pbVar11 = pbVar11 + 1;
      szsrc = szsrc - 1;
    } while (bVar18);
  }
LAB_002c563e:
  iVar4 = (*(code *)((long)&DAT_003a3ec0 + (long)(int)(&DAT_003a3ec0)[uVar5]))
                    (src_param,(code *)((long)&DAT_003a3ec0 + (long)(int)(&DAT_003a3ec0)[uVar5]),
                     uVar8,uVar9 & 0xffffffff,0xffffffff);
  return iVar4;
LAB_002c548b:
  uVar5 = uVar5 - 1;
  src_param = (char *)(pbVar16 + 1);
  szsrc = szsrc - 1;
  pbVar15 = pbVar15 + 1;
  pbVar12 = pbVar12 + 1;
  iVar4 = iVar4 + -1;
  pbVar14 = pbVar14 + 1;
  if (uVar5 < 5) {
    szsrc = 3;
LAB_002c5683:
    uVar5 = 0;
    pbVar11 = pbVar16;
    goto LAB_002c56fc;
  }
  goto LAB_002c5471;
LAB_002c54ef:
  uVar5 = szsrc;
  pbVar11 = pbVar15;
  uVar10 = (uint)pbVar11[-1];
  uVar6 = (uint)unbase64[uVar10];
  if (unbase64[uVar10] < '\0') {
    if ((uVar10 - 9 < 5) || (uVar10 == 0x20)) goto LAB_002c54c7;
    goto LAB_002c56c0;
  }
  goto LAB_002c5532;
LAB_002c54c7:
  szsrc = uVar5 - 1;
  uVar3 = uVar3 - 1;
  pbVar12 = pbVar12 + 1;
  iVar4 = iVar4 + -1;
  pbVar14 = pbVar14 + 1;
  pbVar15 = pbVar11 + 1;
  if (szsrc < 4) {
LAB_002c56c0:
    szsrc = uVar5 - 2;
    uVar5 = 1;
    src_param = (char *)pbVar16;
    goto LAB_002c56fc;
  }
  goto LAB_002c54ef;
LAB_002c5532:
  uVar5 = uVar3;
  pbVar11 = pbVar12;
  uVar10 = (uint)pbVar11[-1];
  uVar6 = (uint)unbase64[uVar10];
  if (unbase64[uVar10] < '\0') {
    pbVar16 = (byte *)(ulong)(uVar10 - 9);
    if ((uVar10 - 9 < 5) || (uVar10 == 0x20)) goto LAB_002c550f;
    goto LAB_002c56df;
  }
  goto LAB_002c5545;
LAB_002c550f:
  uVar3 = uVar5 - 1;
  iVar4 = iVar4 + -1;
  pbVar14 = pbVar14 + 1;
  pbVar12 = pbVar11 + 1;
  if ((int)uVar3 < 3) {
LAB_002c56df:
    szsrc = uVar5 - 2;
    uVar5 = 2;
    src_param = (char *)pbVar16;
    goto LAB_002c56fc;
  }
  goto LAB_002c5532;
LAB_002c5545:
  iVar2 = iVar4;
  pbVar11 = pbVar14;
  bVar1 = pbVar11[-1];
  uVar10 = (uint)bVar1;
  uVar6 = (uint)unbase64[bVar1];
  if (unbase64[bVar1] < '\0') {
    if ((bVar1 - 9 < 5) || (bVar1 == 0x20)) goto LAB_002c5561;
    goto LAB_002c5828;
  }
  szsrc = iVar2 - 2;
  uVar10 = (uint)bVar1;
LAB_002c5583:
  uVar9 = (ulong)((int)uVar9 + 3);
  uVar5 = 0;
  src_param = (char *)pbVar16;
  if (szsrc < 4) goto LAB_002c56fc;
  goto LAB_002c53f8;
LAB_002c5561:
  pbVar14 = pbVar11 + 1;
  iVar4 = iVar2 + -1;
  if (iVar2 + -1 < 2) {
LAB_002c5828:
    szsrc = iVar2 - 2;
    uVar5 = 3;
    src_param = (char *)pbVar16;
    goto LAB_002c56fc;
  }
  goto LAB_002c5545;
LAB_002c52a8:
  uVar5 = uVar5 - 1;
  src_param = (char *)(pbVar14 + 1);
  szsrc = szsrc - 1;
  pbVar16 = pbVar16 + 1;
  pbVar15 = pbVar15 + 1;
  iVar4 = iVar4 + -1;
  pbVar12 = pbVar12 + 1;
  if (uVar5 < 5) {
    szsrc = 3;
LAB_002c5662:
    uVar5 = 0;
    uVar9 = uVar13 & 0xffffffff;
    uVar8 = uVar7;
    pbVar11 = pbVar14;
    uVar6 = uVar17;
    goto LAB_002c56fc;
  }
  goto LAB_002c528d;
LAB_002c5308:
  uVar5 = szsrc;
  pbVar11 = pbVar16;
  uVar10 = (uint)pbVar11[-1];
  uVar6 = (uint)unbase64[uVar10];
  src_param = (char *)pbVar14;
  if (unbase64[uVar10] < '\0') {
    if ((uVar10 - 9 < 5) || (uVar10 == 0x20)) goto LAB_002c52e1;
    goto LAB_002c5687;
  }
  uVar17 = uVar17 << 6 | uVar6;
LAB_002c531d:
  uVar5 = uVar3;
  pbVar11 = pbVar15;
  bVar1 = pbVar11[-1];
  uVar6 = (uint)unbase64[bVar1];
  if (unbase64[bVar1] < '\0') {
    if ((bVar1 - 9 < 5) || (bVar1 == 0x20)) goto LAB_002c533b;
    goto LAB_002c56ce;
  }
  uVar17 = uVar17 << 6 | uVar6;
LAB_002c5365:
  iVar2 = iVar4;
  pbVar11 = pbVar12;
  bVar1 = pbVar11[-1];
  uVar10 = (uint)bVar1;
  uVar6 = (uint)unbase64[bVar1];
  if (unbase64[bVar1] < '\0') {
    if ((bVar1 - 9 < 5) || (bVar1 == 0x20)) goto LAB_002c5381;
    goto LAB_002c56e9;
  }
  szsrc = iVar2 - 2;
  uVar7 = (ulong)(uVar17 << 6 | uVar6);
LAB_002c53af:
  uVar9 = uVar13 + 3;
  if (szdest < (int)uVar9) {
    return -1;
  }
  *(ushort *)(dest + uVar13 + 1) = (ushort)uVar7 << 8 | (ushort)uVar7 >> 8;
  uVar8 = uVar7 >> 0x10;
  dest[uVar13] = (char)(uVar7 >> 0x10);
  uVar5 = 0;
  uVar7 = uVar8;
  uVar13 = uVar9;
  if (szsrc < 4) goto LAB_002c56fc;
  goto LAB_002c5215;
LAB_002c52e1:
  szsrc = uVar5 - 1;
  uVar3 = uVar3 - 1;
  pbVar15 = pbVar15 + 1;
  iVar4 = iVar4 + -1;
  pbVar12 = pbVar12 + 1;
  pbVar16 = pbVar11 + 1;
  if (szsrc < 4) {
LAB_002c5687:
    szsrc = uVar5 - 2;
    uVar5 = 1;
    goto LAB_002c56f1;
  }
  goto LAB_002c5308;
LAB_002c533b:
  uVar3 = uVar5 - 1;
  iVar4 = iVar4 + -1;
  pbVar12 = pbVar12 + 1;
  pbVar15 = pbVar11 + 1;
  if ((int)uVar3 < 3) {
LAB_002c56ce:
    szsrc = uVar5 - 2;
    uVar5 = 2;
    uVar10 = (uint)bVar1;
    goto LAB_002c56f1;
  }
  goto LAB_002c531d;
LAB_002c5381:
  pbVar12 = pbVar11 + 1;
  iVar4 = iVar2 + -1;
  if (1 < iVar2 + -1) goto LAB_002c5365;
LAB_002c56e9:
  szsrc = iVar2 - 2;
  uVar5 = 3;
  uVar10 = (uint)bVar1;
LAB_002c56f1:
  uVar9 = uVar13 & 0xffffffff;
  uVar8 = (ulong)uVar17;
LAB_002c56fc:
  if ((int)uVar6 < 0) {
    if ((uVar10 == 0x3d) || (uVar10 == 0x2e)) goto LAB_002c573f;
    if (uVar10 == 0) goto LAB_002c559c;
    if ((4 < uVar10 - 9) && (uVar10 != 0x20)) {
      return -1;
    }
  }
  if ((uVar10 == 0x3d) || (uVar10 == 0x2e)) {
LAB_002c573f:
    iVar4 = (*(code *)((long)&DAT_003a3ec0 + (long)(int)(&DAT_003a3ec0)[uVar5]))
                      ((code *)((long)&DAT_003a3ec0 + (long)(int)(&DAT_003a3ec0)[uVar5]),szsrc + 1,
                       uVar8,uVar9 & 0xffffffff,0xffffffff,pbVar11 + -1);
    return iVar4;
  }
  goto LAB_002c559c;
}

Assistant:

int Base64UnescapeInternal(const char *src_param, int szsrc,
                           char *dest, int szdest,
                           const signed char* unbase64) {
  static const char kPad64Equals = '=';
  static const char kPad64Dot = '.';

  int decode = 0;
  int destidx = 0;
  int state = 0;
  unsigned int ch = 0;
  unsigned int temp = 0;

  // If "char" is signed by default, using *src as an array index results in
  // accessing negative array elements. Treat the input as a pointer to
  // unsigned char to avoid this.
  const unsigned char *src = reinterpret_cast<const unsigned char*>(src_param);

  // The GET_INPUT macro gets the next input character, skipping
  // over any whitespace, and stopping when we reach the end of the
  // string or when we read any non-data character.  The arguments are
  // an arbitrary identifier (used as a label for goto) and the number
  // of data bytes that must remain in the input to avoid aborting the
  // loop.
#define GET_INPUT(label, remain)                 \
  label:                                         \
    --szsrc;                                     \
    ch = *src++;                                 \
    decode = unbase64[ch];                       \
    if (decode < 0) {                            \
      if (ascii_isspace(ch) && szsrc >= remain)  \
        goto label;                              \
      state = 4 - remain;                        \
      break;                                     \
    }

  // if dest is null, we're just checking to see if it's legal input
  // rather than producing output.  (I suspect this could just be done
  // with a regexp...).  We duplicate the loop so this test can be
  // outside it instead of in every iteration.

  if (dest) {
    // This loop consumes 4 input bytes and produces 3 output bytes
    // per iteration.  We can't know at the start that there is enough
    // data left in the string for a full iteration, so the loop may
    // break out in the middle; if so 'state' will be set to the
    // number of input bytes read.

    while (szsrc >= 4)  {
      // We'll start by optimistically assuming that the next four
      // bytes of the string (src[0..3]) are four good data bytes
      // (that is, no nulls, whitespace, padding chars, or illegal
      // chars).  We need to test src[0..2] for nulls individually
      // before constructing temp to preserve the property that we
      // never read past a null in the string (no matter how long
      // szsrc claims the string is).

      if (!src[0] || !src[1] || !src[2] ||
          (temp = ((unsigned(unbase64[src[0]]) << 18) |
                   (unsigned(unbase64[src[1]]) << 12) |
                   (unsigned(unbase64[src[2]]) << 6) |
                   (unsigned(unbase64[src[3]])))) & 0x80000000) {
        // Iff any of those four characters was bad (null, illegal,
        // whitespace, padding), then temp's high bit will be set
        // (because unbase64[] is -1 for all bad characters).
        //
        // We'll back up and resort to the slower decoder, which knows
        // how to handle those cases.

        GET_INPUT(first, 4);
        temp = decode;
        GET_INPUT(second, 3);
        temp = (temp << 6) | decode;
        GET_INPUT(third, 2);
        temp = (temp << 6) | decode;
        GET_INPUT(fourth, 1);
        temp = (temp << 6) | decode;
      } else {
        // We really did have four good data bytes, so advance four
        // characters in the string.

        szsrc -= 4;
        src += 4;
        decode = -1;
        ch = '\0';
      }

      // temp has 24 bits of input, so write that out as three bytes.

      if (destidx+3 > szdest) return -1;
      dest[destidx+2] = temp;
      temp >>= 8;
      dest[destidx+1] = temp;
      temp >>= 8;
      dest[destidx] = temp;
      destidx += 3;
    }
  } else {
    while (szsrc >= 4)  {
      if (!src[0] || !src[1] || !src[2] ||
          (temp = ((unsigned(unbase64[src[0]]) << 18) |
                   (unsigned(unbase64[src[1]]) << 12) |
                   (unsigned(unbase64[src[2]]) << 6) |
                   (unsigned(unbase64[src[3]])))) & 0x80000000) {
        GET_INPUT(first_no_dest, 4);
        GET_INPUT(second_no_dest, 3);
        GET_INPUT(third_no_dest, 2);
        GET_INPUT(fourth_no_dest, 1);
      } else {
        szsrc -= 4;
        src += 4;
        decode = -1;
        ch = '\0';
      }
      destidx += 3;
    }
  }

#undef GET_INPUT

  // if the loop terminated because we read a bad character, return
  // now.
  if (decode < 0 && ch != '\0' &&
      ch != kPad64Equals && ch != kPad64Dot && !ascii_isspace(ch))
    return -1;

  if (ch == kPad64Equals || ch == kPad64Dot) {
    // if we stopped by hitting an '=' or '.', un-read that character -- we'll
    // look at it again when we count to check for the proper number of
    // equals signs at the end.
    ++szsrc;
    --src;
  } else {
    // This loop consumes 1 input byte per iteration.  It's used to
    // clean up the 0-3 input bytes remaining when the first, faster
    // loop finishes.  'temp' contains the data from 'state' input
    // characters read by the first loop.
    while (szsrc > 0)  {
      --szsrc;
      ch = *src++;
      decode = unbase64[ch];
      if (decode < 0) {
        if (ascii_isspace(ch)) {
          continue;
        } else if (ch == '\0') {
          break;
        } else if (ch == kPad64Equals || ch == kPad64Dot) {
          // back up one character; we'll read it again when we check
          // for the correct number of pad characters at the end.
          ++szsrc;
          --src;
          break;
        } else {
          return -1;
        }
      }

      // Each input character gives us six bits of output.
      temp = (temp << 6) | decode;
      ++state;
      if (state == 4) {
        // If we've accumulated 24 bits of output, write that out as
        // three bytes.
        if (dest) {
          if (destidx+3 > szdest) return -1;
          dest[destidx+2] = temp;
          temp >>= 8;
          dest[destidx+1] = temp;
          temp >>= 8;
          dest[destidx] = temp;
        }
        destidx += 3;
        state = 0;
        temp = 0;
      }
    }
  }

  // Process the leftover data contained in 'temp' at the end of the input.
  int expected_equals = 0;
  switch (state) {
    case 0:
      // Nothing left over; output is a multiple of 3 bytes.
      break;

    case 1:
      // Bad input; we have 6 bits left over.
      return -1;

    case 2:
      // Produce one more output byte from the 12 input bits we have left.
      if (dest) {
        if (destidx+1 > szdest) return -1;
        temp >>= 4;
        dest[destidx] = temp;
      }
      ++destidx;
      expected_equals = 2;
      break;

    case 3:
      // Produce two more output bytes from the 18 input bits we have left.
      if (dest) {
        if (destidx+2 > szdest) return -1;
        temp >>= 2;
        dest[destidx+1] = temp;
        temp >>= 8;
        dest[destidx] = temp;
      }
      destidx += 2;
      expected_equals = 1;
      break;

    default:
      // state should have no other values at this point.
      GOOGLE_LOG(FATAL) << "This can't happen; base64 decoder state = " << state;
  }

  // The remainder of the string should be all whitespace, mixed with
  // exactly 0 equals signs, or exactly 'expected_equals' equals
  // signs.  (Always accepting 0 equals signs is a google extension
  // not covered in the RFC, as is accepting dot as the pad character.)

  int equals = 0;
  while (szsrc > 0 && *src) {
    if (*src == kPad64Equals || *src == kPad64Dot)
      ++equals;
    else if (!ascii_isspace(*src))
      return -1;
    --szsrc;
    ++src;
  }

  return (equals == 0 || equals == expected_equals) ? destidx : -1;
}